

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexSearchImpl
              (ScriptContext *scriptContext,JavascriptRegExp *regularExpression,
              JavascriptString *input)

{
  RegexPattern *pattern;
  charcount_t inputLength;
  char16 *input_00;
  GroupInfo lastSuccessfulMatch;
  GroupInfo GVar1;
  
  pattern = (regularExpression->pattern).ptr;
  input_00 = JavascriptString::GetString(input);
  inputLength = JavascriptString::GetLength(input);
  RegexHelperTrace(scriptContext,Search,regularExpression,input);
  lastSuccessfulMatch = SimpleMatch(scriptContext,pattern,input_00,inputLength,0);
  UnifiedRegex::RegexPattern::IsGlobal(pattern);
  UnifiedRegex::RegexPattern::IsSticky(pattern);
  PropagateLastMatchToCtor(scriptContext,regularExpression,input,lastSuccessfulMatch,false);
  GVar1.offset = 0xffffffff;
  GVar1.length = 0xfffffffe;
  if ((ulong)lastSuccessfulMatch < 0xfffffffeffffffff) {
    GVar1 = lastSuccessfulMatch;
  }
  return (Var)((ulong)GVar1 & 0xffffffff | 0x1000000000000);
}

Assistant:

Var RegexHelper::RegexSearchImpl(ScriptContext* scriptContext, JavascriptRegExp* regularExpression, JavascriptString* input)
    {
        UnifiedRegex::RegexPattern* pattern = regularExpression->GetPattern();
        const char16* inputStr = input->GetString();
        CharCount inputLength = input->GetLength();

#if ENABLE_REGEX_CONFIG_OPTIONS
        RegexHelperTrace(scriptContext, UnifiedRegex::RegexStats::Search, regularExpression, input);
#endif
        UnifiedRegex::GroupInfo match = RegexHelper::SimpleMatch(scriptContext, pattern, inputStr, inputLength, 0);

        PropagateLastMatch(scriptContext, pattern->IsGlobal(), pattern->IsSticky(), regularExpression, input, match, match, false, true);

        return JavascriptNumber::ToVar(match.IsUndefined() ? -1 : (int32)match.offset, scriptContext);
    }